

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void * cm_expat_XML_GetBuffer(XML_Parser parser,int len)

{
  int iVar1;
  void *__dest;
  int local_38;
  int local_34;
  int xmKeep;
  int bufferSize;
  char *newBuf;
  int offset;
  int keep;
  int neededSize;
  int len_local;
  XML_Parser parser_local;
  
  if (*(long *)((long)parser + 0x40) - *(long *)((long)parser + 0x38) < (long)len) {
    newBuf._4_4_ = (int)*(undefined8 *)((long)parser + 0x30) -
                   (int)*(undefined8 *)((long)parser + 0x10);
    if (0x400 < newBuf._4_4_) {
      newBuf._4_4_ = 0x400;
    }
    iVar1 = newBuf._4_4_ +
            len + ((int)*(undefined8 *)((long)parser + 0x38) -
                  (int)*(undefined8 *)((long)parser + 0x30));
    if (*(long *)((long)parser + 0x40) - *(long *)((long)parser + 0x10) < (long)iVar1) {
      local_34 = (int)*(undefined8 *)((long)parser + 0x40) -
                 (int)*(undefined8 *)((long)parser + 0x30);
      if (local_34 == 0) {
        local_34 = 0x400;
      }
      do {
        local_34 = local_34 << 1;
      } while (local_34 < iVar1);
      __dest = (void *)(**(code **)((long)parser + 0x18))((long)local_34);
      if (__dest == (void *)0x0) {
        *(undefined4 *)((long)parser + 0x210) = 1;
        return (void *)0x0;
      }
      *(long *)((long)parser + 0x40) = (long)__dest + (long)local_34;
      if (*(long *)((long)parser + 0x30) == 0) {
        *(long *)((long)parser + 0x38) =
             (long)__dest + (*(long *)((long)parser + 0x38) - *(long *)((long)parser + 0x30));
        *(void **)((long)parser + 0x10) = __dest;
        *(void **)((long)parser + 0x30) = __dest;
      }
      else {
        local_38 = (int)*(undefined8 *)((long)parser + 0x30) -
                   (int)*(undefined8 *)((long)parser + 0x10);
        if (0x400 < local_38) {
          local_38 = 0x400;
        }
        memcpy(__dest,(void *)(*(long *)((long)parser + 0x30) + (long)-local_38),
               (*(long *)((long)parser + 0x38) - *(long *)((long)parser + 0x30)) + (long)local_38);
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x10));
        *(void **)((long)parser + 0x10) = __dest;
        *(long *)((long)parser + 0x38) =
             *(long *)((long)parser + 0x10) +
             (*(long *)((long)parser + 0x38) - *(long *)((long)parser + 0x30)) + (long)local_38;
        *(long *)((long)parser + 0x30) = *(long *)((long)parser + 0x10) + (long)local_38;
      }
    }
    else if ((long)newBuf._4_4_ < *(long *)((long)parser + 0x30) - *(long *)((long)parser + 0x10)) {
      iVar1 = ((int)*(undefined8 *)((long)parser + 0x30) - (int)*(undefined8 *)((long)parser + 0x10)
              ) - newBuf._4_4_;
      memmove(*(void **)((long)parser + 0x10),(void *)(*(long *)((long)parser + 0x10) + (long)iVar1)
              ,(*(long *)((long)parser + 0x38) - *(long *)((long)parser + 0x30)) +
               (long)newBuf._4_4_);
      *(long *)((long)parser + 0x38) = *(long *)((long)parser + 0x38) - (long)iVar1;
      *(long *)((long)parser + 0x30) = *(long *)((long)parser + 0x30) - (long)iVar1;
    }
  }
  return *(void **)((long)parser + 0x38);
}

Assistant:

void *XML_GetBuffer(XML_Parser parser, int len)
{
  if (len > bufferLim - bufferEnd) {
    /* FIXME avoid integer overflow */
    int neededSize = len + (bufferEnd - bufferPtr);
#ifdef XML_CONTEXT_BYTES
    int keep = bufferPtr - buffer;

    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    neededSize += keep;
#endif  /* defined XML_CONTEXT_BYTES */
    if (neededSize  <= bufferLim - buffer) {
#ifdef XML_CONTEXT_BYTES
      if (keep < bufferPtr - buffer) {
        int offset = (bufferPtr - buffer) - keep;
        memmove(buffer, &buffer[offset], bufferEnd - bufferPtr + keep);
        bufferEnd -= offset;
        bufferPtr -= offset;
      }
#else
      memmove(buffer, bufferPtr, bufferEnd - bufferPtr);
      bufferEnd = buffer + (bufferEnd - bufferPtr);
      bufferPtr = buffer;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    else {
      char *newBuf;
      int bufferSize = bufferLim - bufferPtr;
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        bufferSize *= 2;
      } while (bufferSize < neededSize);
      newBuf = MALLOC(bufferSize);
      if (newBuf == 0) {
        errorCode = XML_ERROR_NO_MEMORY;
        return 0;
      }
      bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (bufferPtr) {
        int xmKeep = bufferPtr - buffer;
        if (xmKeep > XML_CONTEXT_BYTES)
          xmKeep = XML_CONTEXT_BYTES;
        memcpy(newBuf, &bufferPtr[-xmKeep], bufferEnd - bufferPtr + xmKeep);
        FREE(buffer);
        buffer = newBuf;
        bufferEnd = buffer + (bufferEnd - bufferPtr) + xmKeep;
        bufferPtr = buffer + xmKeep;
      }
      else {
        bufferEnd = newBuf + (bufferEnd - bufferPtr);
        bufferPtr = buffer = newBuf;
      }
#else
      if (bufferPtr) {
        memcpy(newBuf, bufferPtr, bufferEnd - bufferPtr);
        FREE(buffer);
      }
      bufferEnd = newBuf + (bufferEnd - bufferPtr);
      bufferPtr = buffer = newBuf;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
  }
  return bufferEnd;
}